

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

FloatParts
minmax_floats(FloatParts a,FloatParts b,_Bool ismin,_Bool ieee,_Bool ismag,float_status *s)

{
  FloatParts FVar1;
  int iVar2;
  ulong uVar3;
  FloatClass FVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  FloatClass FVar11;
  byte bVar12;
  FloatParts FVar13;
  
  uVar8 = a._8_8_;
  uVar9 = a.frac;
  uVar3 = b._8_8_;
  uVar5 = b.frac;
  FVar4 = a.cls;
  FVar11 = b.cls;
  if ((FVar4 < float_class_qnan) && (FVar11 < float_class_qnan)) {
    if (FVar4 == float_class_zero) {
      iVar7 = -0x80000000;
    }
    else {
      uVar10 = a._12_4_ & 0xff;
      iVar7 = 0x7fffffff;
      if (uVar10 != 3) {
        if (uVar10 != 2) {
          iVar7 = 0xb30;
          goto LAB_00cfdda2;
        }
        iVar7 = a.exp;
      }
    }
    if (FVar11 == float_class_zero) {
      iVar2 = -0x80000000;
    }
    else {
      uVar10 = b._12_4_ & 0xff;
      iVar2 = 0x7fffffff;
      if (uVar10 != 3) {
        if (uVar10 != 2) {
          iVar7 = 0xb3e;
LAB_00cfdda2:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,iVar7,(char *)0x0);
        }
        iVar2 = b.exp;
      }
    }
    if ((ismag) && (iVar7 != iVar2 || uVar9 != uVar5)) {
      bVar6 = iVar7 < iVar2;
      if (iVar7 == iVar2) {
        bVar6 = uVar9 < uVar5;
      }
      bVar12 = bVar6 ^ ismin;
    }
    else {
      if (((uVar3 ^ uVar8) >> 0x28 & 1) == 0) {
        bVar6 = iVar7 < iVar2;
        if (iVar7 == iVar2) {
          bVar6 = uVar9 < uVar5;
        }
        bVar12 = a.sign ^ ismin ^ bVar6;
      }
      else {
        bVar12 = a.sign ^ ismin;
      }
      bVar12 = bVar12 & 1;
    }
    if (bVar12 == 0) {
      uVar5 = uVar9;
    }
    FVar1.exp = (int)uVar8;
    FVar1.cls = (char)(uVar8 >> 0x20);
    FVar1.sign = (_Bool)(char)(uVar8 >> 0x28);
    FVar1._14_2_ = (short)(uVar8 >> 0x30);
    FVar1.frac = uVar5;
    FVar13.exp = (int)uVar3;
    FVar13.cls = (char)(uVar3 >> 0x20);
    FVar13.sign = (_Bool)(char)(uVar3 >> 0x28);
    FVar13._14_2_ = (short)(uVar3 >> 0x30);
    FVar13.frac = uVar5;
    if (bVar12 == 0) {
      FVar13 = FVar1;
    }
  }
  else if (((!ieee) || ((FVar4 == float_class_snan || (FVar11 == float_class_snan)))) ||
          ((FVar13 = b, FVar4 < float_class_qnan || float_class_inf < FVar11 &&
           (FVar13 = a, float_class_inf < FVar4 || FVar11 < float_class_qnan)))) {
    FVar13 = pick_nan(a,b,s);
  }
  return FVar13;
}

Assistant:

static FloatParts minmax_floats(FloatParts a, FloatParts b, bool ismin,
                                bool ieee, bool ismag, float_status *s)
{
    if (unlikely(is_nan(a.cls) || is_nan(b.cls))) {
        if (ieee) {
            /* Takes two floating-point values `a' and `b', one of
             * which is a NaN, and returns the appropriate NaN
             * result. If either `a' or `b' is a signaling NaN,
             * the invalid exception is raised.
             */
            if (is_snan(a.cls) || is_snan(b.cls)) {
                return pick_nan(a, b, s);
            } else if (is_nan(a.cls) && !is_nan(b.cls)) {
                return b;
            } else if (is_nan(b.cls) && !is_nan(a.cls)) {
                return a;
            }
        }
        return pick_nan(a, b, s);
    } else {
        int a_exp = 0, b_exp = 0;

        switch (a.cls) {
        case float_class_normal:
            a_exp = a.exp;
            break;
        case float_class_inf:
            a_exp = INT_MAX;
            break;
        case float_class_zero:
            a_exp = INT_MIN;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        switch (b.cls) {
        case float_class_normal:
            b_exp = b.exp;
            break;
        case float_class_inf:
            b_exp = INT_MAX;
            break;
        case float_class_zero:
            b_exp = INT_MIN;
            break;
        default:
            g_assert_not_reached();
            break;
        }

        if (ismag && (a_exp != b_exp || a.frac != b.frac)) {
            bool a_less = a_exp < b_exp;
            if (a_exp == b_exp) {
                a_less = a.frac < b.frac;
            }
            return a_less ^ ismin ? b : a;
        }

        if (a.sign == b.sign) {
            bool a_less = a_exp < b_exp;
            if (a_exp == b_exp) {
                a_less = a.frac < b.frac;
            }
            return a.sign ^ a_less ^ ismin ? b : a;
        } else {
            return a.sign ^ ismin ? b : a;
        }
    }
}